

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Expression_*> * __thiscall
wasm::IRBuilder::build(Result<wasm::Expression_*> *__return_storage_ptr__,IRBuilder *this)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  reference ppEVar4;
  value_type local_88;
  Expression *expr;
  Err local_78;
  allocator<char> local_41;
  Err local_40;
  Block *local_20;
  IRBuilder *local_18;
  IRBuilder *this_local;
  
  local_18 = this;
  this_local = (IRBuilder *)__return_storage_ptr__;
  bVar1 = std::vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>::empty
                    (&this->scopeStack);
  if (bVar1) {
    local_20 = Builder::makeBlock(&this->builder,(Expression *)0x0);
    Result<wasm::Expression*>::Result<wasm::Block*>
              ((Result<wasm::Expression*> *)__return_storage_ptr__,&local_20);
  }
  else {
    sVar2 = std::vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>::size
                      (&this->scopeStack);
    if (sVar2 < 2) {
      pvVar3 = std::vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>::
               back(&this->scopeStack);
      bVar1 = ScopeCtx::isNone(pvVar3);
      if (bVar1) {
        pvVar3 = std::vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>
                 ::back(&this->scopeStack);
        sVar2 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                          (&pvVar3->exprStack);
        if (1 < sVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_78,"unused expressions without block context",
                     (allocator<char> *)((long)&expr + 7));
          Result<wasm::Expression_*>::Result(__return_storage_ptr__,&local_78);
          wasm::Err::~Err(&local_78);
          std::allocator<char>::~allocator((allocator<char> *)((long)&expr + 7));
          return __return_storage_ptr__;
        }
        pvVar3 = std::vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>
                 ::back(&this->scopeStack);
        sVar2 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                          (&pvVar3->exprStack);
        if (sVar2 == 1) {
          pvVar3 = std::
                   vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>::
                   back(&this->scopeStack);
          ppEVar4 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::back
                              (&pvVar3->exprStack);
          local_88 = *ppEVar4;
          std::vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>::clear
                    (&this->scopeStack);
          std::
          unordered_map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
          ::clear(&this->labelDepths);
          Result<wasm::Expression*>::Result<wasm::Expression*>
                    ((Result<wasm::Expression*> *)__return_storage_ptr__,&local_88);
          return __return_storage_ptr__;
        }
        __assert_fail("scopeStack.back().exprStack.size() == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp"
                      ,0xae,"Result<Expression *> wasm::IRBuilder::build()");
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"unfinished block context",&local_41);
    Result<wasm::Expression_*>::Result(__return_storage_ptr__,&local_40);
    wasm::Err::~Err(&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<Expression*> IRBuilder::build() {
  if (scopeStack.empty()) {
    return builder.makeBlock();
  }
  if (scopeStack.size() > 1 || !scopeStack.back().isNone()) {
    return Err{"unfinished block context"};
  }
  if (scopeStack.back().exprStack.size() > 1) {
    return Err{"unused expressions without block context"};
  }
  assert(scopeStack.back().exprStack.size() == 1);
  auto* expr = scopeStack.back().exprStack.back();
  scopeStack.clear();
  labelDepths.clear();
  return expr;
}